

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_buf.h
# Opt level: O2

void __thiscall io_buf::~io_buf(io_buf *this)

{
  this->_vptr_io_buf = (_func_int **)&PTR_open_file_002abfa0;
  v_array<int>::delete_v(&this->files);
  v_array<char>::delete_v(&this->space);
  return;
}

Assistant:

virtual ~io_buf()
  {
    files.delete_v();
    space.delete_v();
  }